

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint checkColorValidity(LodePNGColorType colortype,uint bd)

{
  uint bd_local;
  LodePNGColorType colortype_local;
  
  switch(colortype) {
  case LCT_GREY:
    if (((bd != 1) && (bd != 2)) && ((bd != 4 && ((bd != 8 && (bd != 0x10)))))) {
      return 0x25;
    }
    break;
  default:
    return 0x1f;
  case LCT_RGB:
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
    break;
  case LCT_PALETTE:
    if ((((bd != 1) && (bd != 2)) && (bd != 4)) && (bd != 8)) {
      return 0x25;
    }
    break;
  case LCT_GREY_ALPHA:
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
    break;
  case LCT_RGBA:
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
  }
  return 0;
}

Assistant:

static unsigned checkColorValidity(LodePNGColorType colortype, unsigned bd) /*bd = bitdepth*/
{
  switch(colortype)
  {
    case 0: if(!(bd == 1 || bd == 2 || bd == 4 || bd == 8 || bd == 16)) return 37; break; /*grey*/
    case 2: if(!(                                 bd == 8 || bd == 16)) return 37; break; /*RGB*/
    case 3: if(!(bd == 1 || bd == 2 || bd == 4 || bd == 8            )) return 37; break; /*palette*/
    case 4: if(!(                                 bd == 8 || bd == 16)) return 37; break; /*grey + alpha*/
    case 6: if(!(                                 bd == 8 || bd == 16)) return 37; break; /*RGBA*/
    default: return 31;
  }
  return 0; /*allowed color type / bits combination*/
}